

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O2

void duckdb::IntegerAverageOperationHugeint::Finalize<double,duckdb::AvgState<duckdb::hugeint_t>>
               (AvgState<duckdb::hugeint_t> *state,double *target,
               AggregateFinalizeData *finalize_data)

{
  int64_t extraout_RDX;
  longdouble in_ST0;
  longdouble in_ST1;
  hugeint_t input;
  
  if ((longdouble *)state->count != (longdouble *)0x0) {
    GetAverageDivident<long_double>
              ((longdouble *)state->count,(uint64_t)(finalize_data->input->bind_data).ptr,
               (optional_ptr<duckdb::FunctionData,_true>)finalize_data);
    input.upper = extraout_RDX;
    input.lower = (state->value).upper;
    Hugeint::Cast<long_double>((longdouble *)(state->value).lower,input);
    *target = (double)(in_ST1 / in_ST0);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			long double divident = GetAverageDivident<long double>(state.count, finalize_data.input.bind_data);
			target = Hugeint::Cast<long double>(state.value) / divident;
		}
	}